

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskCountCase::init
          (SampleMaskCountCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_4a0;
  MessageBuilder local_320;
  MessageBuilder local_190;
  SampleMaskCountCase *local_10;
  SampleMaskCountCase *this_local;
  
  local_10 = this;
  if ((this->super_SampleMaskBaseCase).m_runMode == RUN_PER_PIXEL) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_190,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_190,(char (*) [28])"Verifying gl_SampleMaskIn.\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [56])
                               "\tFragment shader may be invoked [1, numSamples] times.\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [81])
                               "\t=> gl_SampleMaskIn should have the number of bits set in range [1, numSamples]\n"
                       );
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
  }
  else if ((this->super_SampleMaskBaseCase).m_runMode == RUN_PER_SAMPLE) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_320,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_320,(char (*) [28])"Verifying gl_SampleMaskIn.\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [45])"\tFragment will be invoked numSamples times.\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [51])"\t=> gl_SampleMaskIn should have only one bit set.\n"
                       );
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_320);
  }
  else if ((this->super_SampleMaskBaseCase).m_runMode == RUN_PER_TWO_SAMPLES) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_4a0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_4a0,(char (*) [28])"Verifying gl_SampleMaskIn.\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [73])
                               "\tFragment shader may be invoked [ceil(numSamples/2), numSamples] times.\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [107])
                               "\t=> gl_SampleMaskIn should have the number of bits set in range [1, numSamples - ceil(numSamples/2) + 1]:\n"
                       );
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4a0);
  }
  iVar1 = SampleMaskBaseCase::init(&this->super_SampleMaskBaseCase,ctx);
  return iVar1;
}

Assistant:

void SampleMaskCountCase::init (void)
{
	// log the test method and expectations
	if (m_runMode == RUN_PER_PIXEL)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying gl_SampleMaskIn.\n"
			<< "	Fragment shader may be invoked [1, numSamples] times.\n"
			<< "	=> gl_SampleMaskIn should have the number of bits set in range [1, numSamples]\n"
			<< tcu::TestLog::EndMessage;
	else if (m_runMode == RUN_PER_SAMPLE)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying gl_SampleMaskIn.\n"
			<< "	Fragment will be invoked numSamples times.\n"
			<< "	=> gl_SampleMaskIn should have only one bit set.\n"
			<< tcu::TestLog::EndMessage;
	else if (m_runMode == RUN_PER_TWO_SAMPLES)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying gl_SampleMaskIn.\n"
			<< "	Fragment shader may be invoked [ceil(numSamples/2), numSamples] times.\n"
			<< "	=> gl_SampleMaskIn should have the number of bits set in range [1, numSamples - ceil(numSamples/2) + 1]:\n"
			<< tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);

	SampleMaskBaseCase::init();
}